

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvawatch.c
# Opt level: O2

void * twatchfun(void *x)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  uint32_t uVar4;
  
  pvVar2 = nva_cards[cnum]->bar0;
  uVar4 = *(uint32_t *)((long)pvVar2 + (ulong)(uint)a);
  queue[put] = uVar4;
  tqueue[put] = *(uint32_t *)((long)pvVar2 + 0x9400);
  put = (put + 1) % 0x100000;
  do {
    do {
      uVar1 = *(uint *)((long)pvVar2 + (ulong)(uint)a);
      uVar3 = uVar4 ^ uVar1;
      uVar4 = uVar1;
    } while ((uVar3 & mask) == 0);
    queue[put] = uVar1;
    tqueue[put] = *(uint32_t *)((long)pvVar2 + 0x9400);
    put = (put + 1) % 0x100000;
  } while( true );
}

Assistant:

void *twatchfun(void *x) {
	uint32_t val = nva_rd32(cnum, a);
	queue[put] = val;
	tqueue[put] = nva_rd32(cnum, 0x9400);
	put = (put + 1) % SZ;
	while (1) {
		uint32_t nval = nva_rd32(cnum, a);
		if ((nval & mask) != (val & mask)) {
			queue[put] = nval;
			tqueue[put] = nva_rd32(cnum, 0x9400);
			put = (put + 1) % SZ;
		}
		val = nval;
	}
}